

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::BitsToShortRealFunction::~BitsToShortRealFunction
          (BitsToShortRealFunction *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit BitsToShortRealFunction(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::BitsToShortreal, SubroutineKind::Function, 1,
                               {&builtins.uintType}, builtins.shortRealType, false) {}